

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O3

string * __thiscall
absl::lts_20250127::StrCat_abi_cxx11_
          (string *__return_storage_ptr__,lts_20250127 *this,AlphaNum *a,AlphaNum *b)

{
  pointer __dest;
  size_t __n;
  size_t __n_00;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize
            ((ulong)__return_storage_ptr__,(char)(a->piece_)._M_len + (char)*(undefined8 *)this);
  __dest = (__return_storage_ptr__->_M_dataplus)._M_p;
  __n = *(size_t *)this;
  if (__n != 0) {
    memcpy(__dest,*(void **)(this + 8),__n);
  }
  __n_00 = (a->piece_)._M_len;
  if (__n_00 != 0) {
    memcpy(__dest + __n,(a->piece_)._M_str,__n_00);
  }
  if (__dest + __n + __n_00 == __dest + __return_storage_ptr__->_M_string_length) {
    return __return_storage_ptr__;
  }
  __assert_fail("out == begin + result.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/str_cat.cc"
                ,0x4d,"std::string absl::StrCat(const AlphaNum &, const AlphaNum &)");
}

Assistant:

std::string StrCat(const AlphaNum& a, const AlphaNum& b) {
  std::string result;
  // Use uint64_t to prevent size_t overflow. We assume it is not possible for
  // in memory strings to overflow a uint64_t.
  constexpr uint64_t kMaxSize = uint64_t{std::numeric_limits<size_t>::max()};
  const uint64_t result_size =
      static_cast<uint64_t>(a.size()) + static_cast<uint64_t>(b.size());
  ABSL_INTERNAL_CHECK(result_size <= kMaxSize, "size_t overflow");
  absl::strings_internal::STLStringResizeUninitialized(
      &result, static_cast<size_t>(result_size));
  char* const begin = &result[0];
  char* out = begin;
  out = Append(out, a);
  out = Append(out, b);
  assert(out == begin + result.size());
  return result;
}